

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O0

size_t rcnb_encode(char *plaintext_in,size_t length_in,wchar_t *code_out)

{
  size_t sVar1;
  rcnb_encodestate *state_in;
  wchar_t *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  size_t output_size;
  rcnb_encodestate es;
  long lVar2;
  rcnb_encodestate *in_stack_ffffffffffffffe0;
  
  rcnb_init_encodestate((rcnb_encodestate *)&stack0xffffffffffffffe6);
  lVar2 = 0;
  sVar1 = rcnb_encode_block(in_RDI,in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  state_in = (rcnb_encodestate *)(sVar1 + lVar2);
  sVar1 = rcnb_encode_blockend((wchar_t *)in_stack_ffffffffffffffe0,state_in);
  return (size_t)(&state_in->cached + sVar1);
}

Assistant:

size_t rcnb_encode(const char* plaintext_in, size_t length_in, wchar_t* code_out)
{
    rcnb_encodestate es;
    rcnb_init_encodestate(&es);
    size_t output_size = 0;
    output_size += rcnb_encode_block(plaintext_in, length_in, code_out, &es);
    output_size += rcnb_encode_blockend(code_out + output_size, &es);
    return output_size;
}